

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

short duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<float,short>
                (float input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  VectorTryCastData *data;
  short output;
  float in_stack_0000018c;
  short *in_stack_ffffffffffffff98;
  VectorTryCastData *cast_data;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  float in_stack_ffffffffffffffa4;
  ValidityMask *in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  short local_22;
  short local_2;
  
  bVar1 = NumericTryCast::Operation<float,short>
                    (in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,false);
  if (bVar1) {
    local_2 = local_22;
  }
  else {
    cast_data = (VectorTryCastData *)&stack0xffffffffffffffb0;
    CastExceptionText<float,short>(in_stack_0000018c);
    local_2 = HandleVectorCastError::Operation<short>
                        ((string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         CONCAT44(in_stack_ffffffffffffffa4,
                                  CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                         cast_data);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  return local_2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}